

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_parser.hpp
# Opt level: O0

size_t __thiscall
jsoncons::msgpack::basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::get_size
          (basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,uint8_t type,
          error_code *ec)

{
  byte bVar1;
  type_conflict3 tVar2;
  type_conflict4 tVar3;
  ssize_t sVar4;
  uint8_t *first;
  byte in_SIL;
  size_t in_RDI;
  uint32_t len_2;
  uint8_t buf_2 [4];
  uint16_t len_1;
  uint8_t buf_1 [2];
  uint8_t len;
  uint8_t buf [1];
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_24 [3];
  undefined1 local_21 [25];
  ulong local_8;
  
  first = (uint8_t *)(ulong)(in_SIL - 0xc4);
  switch(first) {
  case (uint8_t *)0x0:
  case (uint8_t *)0x3:
  case (uint8_t *)0x15:
    sVar4 = bytes_source::read((bytes_source *)(in_RDI + 0x18),(int)local_21,(void *)0x1,0xf68a70);
    if (sVar4 == 1) {
      bVar1 = binary::big_to_native<unsigned_char,jsoncons::detail::endian>(first,in_RDI);
      local_8 = (ulong)bVar1;
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (msgpack_errc)((ulong)first >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      local_8 = 0;
    }
    break;
  case (uint8_t *)0x1:
  case (uint8_t *)0x4:
  case (uint8_t *)0x16:
  case (uint8_t *)0x18:
  case (uint8_t *)0x1a:
    sVar4 = bytes_source::read((bytes_source *)(in_RDI + 0x18),(int)local_24,(void *)0x2,0xf68a70);
    if (sVar4 == 2) {
      tVar2 = binary::big_to_native<unsigned_short,jsoncons::detail::endian>(first,in_RDI);
      local_8 = (ulong)tVar2;
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (msgpack_errc)((ulong)first >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      local_8 = 0;
    }
    break;
  case (uint8_t *)0x2:
  case (uint8_t *)0x5:
  case (uint8_t *)0x17:
  case (uint8_t *)0x19:
  case (uint8_t *)0x1b:
    sVar4 = bytes_source::read((bytes_source *)(in_RDI + 0x18),(int)&stack0xffffffffffffffd6,
                               (void *)0x4,0xf68a70);
    if (sVar4 == 4) {
      tVar3 = binary::big_to_native<unsigned_int,jsoncons::detail::endian>(first,in_RDI);
      local_8 = (ulong)tVar3;
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (msgpack_errc)((ulong)first >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      local_8 = 0;
    }
    break;
  default:
    if (((in_SIL < 0x90) || (0x9f < in_SIL)) && ((in_SIL < 0x80 || (0x8f < in_SIL)))) {
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),success
                );
      *(undefined1 *)(in_RDI + 8) = 0;
      local_8 = 0;
    }
    else {
      local_8 = (ulong)(int)(in_SIL & 0xf);
    }
    break;
  case (uint8_t *)0x10:
    local_8 = 1;
    break;
  case (uint8_t *)0x11:
    local_8 = 2;
    break;
  case (uint8_t *)0x12:
    local_8 = 4;
    break;
  case (uint8_t *)0x13:
    local_8 = 8;
    break;
  case (uint8_t *)0x14:
    local_8 = 0x10;
  }
  return local_8;
}

Assistant:

std::size_t get_size(uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::msgpack::msgpack_type::str8_type: 
            case jsoncons::msgpack::msgpack_type::bin8_type: 
            case jsoncons::msgpack::msgpack_type::ext8_type: 
            {
                uint8_t buf[sizeof(int8_t)];
                if (source_.read(buf, sizeof(int8_t)) != sizeof(int8_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint8_t len = binary::big_to_native<uint8_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }

            case jsoncons::msgpack::msgpack_type::str16_type: 
            case jsoncons::msgpack::msgpack_type::bin16_type: 
            case jsoncons::msgpack::msgpack_type::ext16_type: 
            case jsoncons::msgpack::msgpack_type::array16_type: 
            case jsoncons::msgpack::msgpack_type::map16_type:
            {
                uint8_t buf[sizeof(int16_t)];
                if (source_.read(buf, sizeof(int16_t)) != sizeof(int16_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint16_t len = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }

            case jsoncons::msgpack::msgpack_type::str32_type: 
            case jsoncons::msgpack::msgpack_type::bin32_type: 
            case jsoncons::msgpack::msgpack_type::ext32_type: 
            case jsoncons::msgpack::msgpack_type::array32_type: 
            case jsoncons::msgpack::msgpack_type::map32_type : 
            {
                uint8_t buf[sizeof(int32_t)];
                if (source_.read(buf, sizeof(int32_t)) != sizeof(int32_t))
                {
                    ec = msgpack_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                uint32_t len = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                return static_cast<std::size_t>(len);
            }
            case jsoncons::msgpack::msgpack_type::fixext1_type: 
                return 1;
            case jsoncons::msgpack::msgpack_type::fixext2_type: 
                return 2;
            case jsoncons::msgpack::msgpack_type::fixext4_type: 
                return 4;
            case jsoncons::msgpack::msgpack_type::fixext8_type: 
                return 8;
            case jsoncons::msgpack::msgpack_type::fixext16_type: 
                return 16;
            default:
                if ((type > 0x8f && type <= 0x9f) // fixarray
                    || (type > 0x7f && type <= 0x8f) // fixmap
        )
                {
                    return type & 0x0f;
                }
                else
                {
                    ec = msgpack_errc::unknown_type;
                    more_ = false;
                    return 0;
                }
                break;
        }
    }